

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOAddIntArray(FmsIOContext *ctx,char *path,FmsInt *values,FmsInt n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (ctx == (FmsIOContext *)0x0) {
    iVar1 = 1;
  }
  else if (path == (char *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)ctx->fp,"%s/Size: %lu\n",path);
    fprintf((FILE *)ctx->fp,"%s/Type: %s\n",path,"FMS_UINT64");
    if (n != 0) {
      fprintf((FILE *)ctx->fp,"%s/Values: [",path);
      for (uVar3 = 0; uVar3 < n; uVar3 = uVar3 + 1) {
        uVar2 = 0;
        for (; (uVar2 < 3 && (uVar3 < n)); uVar3 = uVar3 + 1) {
          fprintf((FILE *)ctx->fp,"%lu",values[uVar3]);
          if (uVar3 < n - 1) {
            fwrite(", ",2,1,(FILE *)ctx->fp);
          }
          uVar2 = uVar2 + 1;
        }
        if (uVar3 < n - 1) {
          fputc(10,(FILE *)ctx->fp);
        }
      }
      fwrite("]\n",2,1,(FILE *)ctx->fp);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
FmsIOAddIntArray(FmsIOContext *ctx, const char *path, const FmsInt *values,
                 FmsInt n) {
  FmsInt i, j;
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  fprintf(ctx->fp, "%s/Size: " FMS_LU "\n", path, n);
  fprintf(ctx->fp, "%s/Type: %s\n", path, FmsIntTypeNames[FMS_UINT64]);

  if(n) {
    /* Should we make it YAML-like?*/
    fprintf(ctx->fp, "%s/Values: [", path);
    for(i = 0; i < n; ++i) {
      for(j = 0; j < FMS_ELE_PER_LINE && i < n; j++, i++) {
        fprintf(ctx->fp, FMS_LU, values[i]);
        if(i < n-1)
          fprintf(ctx->fp, ", ");
      }
      if(i < n-1)
        fprintf(ctx->fp, "\n");
    }
    fprintf(ctx->fp, "]\n");
  }
  return 0;
}